

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

ReshapeStaticLayerParams * __thiscall
CoreML::Specification::ReshapeStaticLayerParams::New(ReshapeStaticLayerParams *this,Arena *arena)

{
  ReshapeStaticLayerParams *this_00;
  
  this_00 = (ReshapeStaticLayerParams *)operator_new(0x28);
  ReshapeStaticLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ReshapeStaticLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

ReshapeStaticLayerParams* ReshapeStaticLayerParams::New(::google::protobuf::Arena* arena) const {
  ReshapeStaticLayerParams* n = new ReshapeStaticLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}